

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nestl_test.hpp
# Opt level: O2

void nestl::test::detail::
     print_tuple_impl<char,std::char_traits<char>,std::tuple<char_const*,unsigned_long,char_const*,unsigned_long,char_const*>,0ul,1ul,2ul,3ul,4ul>
               (ostream *os,undefined8 *t)

{
  std::operator<<(os,(char *)t[4]);
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::operator<<(os,(char *)t[2]);
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::operator<<(os,(char *)*t);
  return;
}

Assistant:

void print_tuple_impl(std::basic_ostream<Ch, Tr>& os, const Tuple& t, seq<Is...>)
{
    using swallow = int[1 + sizeof...(Is)];
    (void)swallow
    {
        0,
        (void(os << /* (Is == 0 ? "" : ", ") << */ std::get<Is>(t)), 0)...
    };
}